

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

void MouseButtonCallback(GLFWwindow *window,int button,int action,int mods)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined4 local_38;
  undefined8 extraout_XMM0_Qb;
  
  CORE.Input.Mouse.currentButtonState[button] = (char)action;
  local_38 = 0;
  if (((char)action == '\x01') && (CORE.Input.Mouse.previousButtonState[button] == '\0')) {
    local_38 = 1;
  }
  auVar1._0_8_ = GetMousePosition();
  auVar1._8_8_ = extraout_XMM0_Qb;
  auVar2._4_4_ = (float)(int)CORE.Window.currentFbo.height;
  auVar2._0_4_ = (float)(int)CORE.Window.currentFbo.width;
  auVar2._8_8_ = 0;
  auVar2 = divps(auVar1,auVar2);
  ProcessGestureEvent((GestureEvent)ZEXT3256(CONCAT824(auVar2._0_8_,ZEXT824(CONCAT44(1,local_38)))))
  ;
  return;
}

Assistant:

static void MouseButtonCallback(GLFWwindow *window, int button, int action, int mods)
{
    // WARNING: GLFW could only return GLFW_PRESS (1) or GLFW_RELEASE (0) for now,
    // but future releases may add more actions (i.e. GLFW_REPEAT)
    CORE.Input.Mouse.currentButtonState[button] = action;

#if defined(SUPPORT_GESTURES_SYSTEM) && defined(SUPPORT_MOUSE_GESTURES)
    // Process mouse events as touches to be able to use mouse-gestures
    GestureEvent gestureEvent = { 0 };

    // Register touch actions
    if ((CORE.Input.Mouse.currentButtonState[button] == 1) && (CORE.Input.Mouse.previousButtonState[button] == 0)) gestureEvent.touchAction = TOUCH_DOWN;
    else if ((CORE.Input.Mouse.currentButtonState[button] == 0) && (CORE.Input.Mouse.previousButtonState[button] == 1)) gestureEvent.touchAction = TOUCH_UP;

    // NOTE: TOUCH_MOVE event is registered in MouseCursorPosCallback()

    // Assign a pointer ID
    gestureEvent.pointerId[0] = 0;

    // Register touch points count
    gestureEvent.pointCount = 1;

    // Register touch points position, only one point registered
    gestureEvent.position[0] = GetMousePosition();

    // Normalize gestureEvent.position[0] for CORE.Window.screen.width and CORE.Window.screen.height
    gestureEvent.position[0].x /= (float)GetScreenWidth();
    gestureEvent.position[0].y /= (float)GetScreenHeight();

    // Gesture data is sent to gestures system for processing
    ProcessGestureEvent(gestureEvent);
#endif
}